

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

void djgc_ticks(djg_clock *clock,double *tcpu,double *tgpu)

{
  long lVar1;
  undefined1 auVar2 [16];
  GLuint64 stop;
  GLuint64 start;
  GLuint64 local_40;
  GLuint64 local_38;
  
  if (clock != (djg_clock *)0x0) {
    if (clock->is_gpu_ticking == 0) {
      (*glad_glGetQueryObjectiv)(clock->queries[1],0x8867,&clock->is_gpu_ready);
      if (clock->is_gpu_ready != 0) {
        (*glad_glGetQueryObjectui64v)(clock->queries[1],0x8866,&local_40);
        (*glad_glGetQueryObjectui64v)(clock->queries[0],0x8866,&local_38);
        lVar1 = local_40 - local_38;
        auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar2._0_8_ = lVar1;
        auVar2._12_4_ = 0x45300000;
        clock->gpu_ticks =
             ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000000000.0;
      }
    }
    if (tcpu != (double *)0x0) {
      *tcpu = clock->cpu_ticks;
    }
    if (tgpu != (double *)0x0) {
      *tgpu = clock->gpu_ticks;
    }
    return;
  }
  __assert_fail("clock",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x135,"void djgc_ticks(djg_clock *, double *, double *)");
}

Assistant:

DJGDEF void djgc_ticks(djg_clock *clock, double *tcpu, double *tgpu)
{
    DJG_ASSERT(clock);
    if (!clock->is_gpu_ticking) {
        glGetQueryObjectiv(clock->queries[DJGC__QUERY_STOP],
                           GL_QUERY_RESULT_AVAILABLE,
                           &clock->is_gpu_ready);
        if (clock->is_gpu_ready) {
            GLuint64 start, stop;

            glGetQueryObjectui64v(clock->queries[DJGC__QUERY_STOP],
                                  GL_QUERY_RESULT,
                                  &stop);
            glGetQueryObjectui64v(clock->queries[DJGC__QUERY_START],
                                  GL_QUERY_RESULT,
                                  &start);
            clock->gpu_ticks = (stop - start) / 1e9;
        }
    }
    if (tcpu) *tcpu = clock->cpu_ticks;
    if (tgpu) *tgpu = clock->gpu_ticks;
}